

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::setupViewports
          (ViewportIndexSubroutine *this,TEST_TYPE param_1,GLuint iteration_index)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 uStack_48;
  undefined4 uStack_44;
  GLfloat data [8];
  Functions *gl;
  GLuint iteration_index_local;
  TEST_TYPE param_1_local;
  ViewportIndexSubroutine *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_DrawTestBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  data[2] = 64.0;
  data[3] = 0.0;
  data[4] = 64.0;
  data[5] = 128.0;
  uStack_48 = 0;
  uStack_44 = 0;
  data[0] = 64.0;
  data[1] = 128.0;
  (**(code **)(lVar4 + 0x1a00))(0,0,0x80);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0xee4);
  if (iteration_index == 0) {
    (**(code **)(lVar4 + 0x1a08))(4,2,&uStack_48);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ViewportArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xeeb);
  }
  else if (iteration_index == 1) {
    (**(code **)(lVar4 + 0x1a10))(uStack_48,uStack_44,data[0],data[1],4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ViewportIndexedf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xef2);
    (**(code **)(lVar4 + 0x1a10))(data[2],data[3],data[4],data[5],5);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ViewportIndexedf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xef5);
  }
  else {
    if (iteration_index != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xf04);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar4 + 0x1a18))(4,&uStack_48);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ViewportIndexedfv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xefc);
    (**(code **)(lVar4 + 0x1a18))(5,data + 2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ViewportIndexedfv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xeff);
  }
  return;
}

Assistant:

void ViewportIndexSubroutine::setupViewports(TEST_TYPE /* type */, glw::GLuint iteration_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLfloat data[2 * 4] = { 0.0f, 0.0f, 64.0f, 128.0f, 64.0f, 0.0f, 64.0f, 128.0f };

	gl.viewport(0, 0, m_width, m_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

	switch (iteration_index)
	{
	case 0:

		gl.viewportArrayv(4, 2, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");

		break;

	case 1:

		gl.viewportIndexedf(4, data[0], data[1], data[2], data[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedf");

		gl.viewportIndexedf(5, data[4], data[5], data[6], data[7]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedf");

		break;

	case 2:

		gl.viewportIndexedfv(4, &data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedfv");

		gl.viewportIndexedfv(5, &data[4]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedfv");

		break;

	default:
		TCU_FAIL("Invalid value");
	}
}